

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *this_00;
  TargetType TVar1;
  bool local_56;
  allocator<char> local_41;
  string local_40;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  cmGlobalGenerator *this_local;
  
  local_20 = target;
  target_local = (cmGeneratorTarget *)this;
  TVar1 = cmGeneratorTarget::GetType(target);
  this_00 = local_20;
  local_56 = true;
  if (TVar1 != INTERFACE_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"EXCLUDE_FROM_ALL",&local_41);
    local_56 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_40);
  }
  this_local._7_1_ = local_56;
  if (TVar1 != INTERFACE_LIBRARY) {
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmGeneratorTarget* target) const
{
  return target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
    target->GetPropertyAsBool("EXCLUDE_FROM_ALL");
}